

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1103bec::DropoutTest_KeepsLargeClusterOfCoeffs_Test::
~DropoutTest_KeepsLargeClusterOfCoeffs_Test(DropoutTest_KeepsLargeClusterOfCoeffs_Test *this)

{
  void *in_RDI;
  
  ~DropoutTest_KeepsLargeClusterOfCoeffs_Test
            ((DropoutTest_KeepsLargeClusterOfCoeffs_Test *)0xae7328);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DropoutTest, KeepsLargeClusterOfCoeffs) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 6;
  // Large clusters (> kDropoutContinuityMax) of small coeffs should be kept.
  tran_low_t qcoeff_scan[] = { 0, 0, 0, 0, 1, 0,  1, -1,  // should be kept
                               0, 0, 0, 0, 0, 0,  0, 0,   //
                               0, 0, 0, 0, 0, -2, 0, 0,   // should be removed
                               0, 0, 0, 0, 0, 0,  0, 0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 1, 0, 1, -1,  //
                               0, 0, 0, 0, 0, 0, 0, 0,   //
                               0, 0, 0, 0, 0, 0, 0, 0,   //
                               0, 0, 0, 0, 0, 0, 0, 0 });
}